

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_tooltip_begin(nk_context *ctx,float width)

{
  nk_flags *pnVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  int iVar4;
  float fVar5;
  nk_rect rect;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x57c2,"int nk_tooltip_begin(struct nk_context *, float)");
  }
  pnVar2 = ctx->current;
  if (pnVar2 != (nk_window *)0x0) {
    pnVar3 = pnVar2->layout;
    if (pnVar3 != (nk_panel *)0x0) {
      if (((pnVar2->popup).win == (nk_window *)0x0) ||
         (iVar4 = 0,
         ((pnVar2->popup).type & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)
         ) == 0)) {
        fVar5 = (ctx->input).mouse.pos.x + 1.0;
        rect.x = (float)(int)(float)(int)((int)fVar5 - (uint)(fVar5 < 0.0)) - (pnVar3->clip).x;
        fVar5 = (ctx->input).mouse.pos.y + 1.0;
        rect.y = (float)(int)(float)(int)((int)fVar5 - (uint)(fVar5 < 0.0)) - (pnVar3->clip).y;
        rect.w = (float)(int)((uint)((float)(int)width < width) + (int)width);
        rect.h = 16384.0;
        iVar4 = nk_popup_begin(ctx,NK_POPUP_DYNAMIC,"__##Tooltip##__",0x21,rect);
        if (iVar4 != 0) {
          pnVar1 = &pnVar2->layout->flags;
          *pnVar1 = *pnVar1 & 0xffffefff;
        }
        (pnVar2->popup).type = NK_PANEL_TOOLTIP;
        ctx->current->layout->type = NK_PANEL_TOOLTIP;
      }
      return iVar4;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x57c4,"int nk_tooltip_begin(struct nk_context *, float)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x57c3,"int nk_tooltip_begin(struct nk_context *, float)");
}

Assistant:

NK_API int
nk_tooltip_begin(struct nk_context *ctx, float width)
{
    struct nk_window *win;
    const struct nk_input *in;
    struct nk_rect bounds;
    int ret;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* make sure that no nonblocking popup is currently active */
    win = ctx->current;
    in = &ctx->input;
    if (win->popup.win && (win->popup.type & NK_PANEL_SET_NONBLOCK))
        return 0;

    bounds.w = (float) nk_iceilf(width);
    bounds.h = (float) nk_iceilf(nk_null_rect.h);
    bounds.x = nk_ifloorf(in->mouse.pos.x + 1) - win->layout->clip.x;
    bounds.y = nk_ifloorf(in->mouse.pos.y + 1) - win->layout->clip.y;

    ret = nk_popup_begin(ctx, NK_POPUP_DYNAMIC,
        "__##Tooltip##__", NK_WINDOW_NO_SCROLLBAR|NK_WINDOW_BORDER, bounds);
    if (ret) win->layout->flags &= ~(nk_flags)NK_WINDOW_ROM;
    win->popup.type = NK_PANEL_TOOLTIP;
    ctx->current->layout->type = NK_PANEL_TOOLTIP;
    return ret;
}